

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_> *
__thiscall
capnp::compiler::Compiler::CompiledModule::getFileImportTable
          (Orphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
           *__return_storage_ptr__,CompiledModule *this,Orphanage orphanage)

{
  ArrayPtr<const_char> importPath;
  ArrayPtr<const_char> value;
  Reader decl;
  Maybe<capnp::compiler::Compiler::CompiledModule_&> MVar1;
  _Base_ptr p_Var2;
  ElementCount index;
  set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> importNames;
  BuilderFor<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>_>
  builder;
  Builder entry;
  Fault local_100;
  Orphanage local_f8;
  _Rb_tree<kj::StringPtr,_kj::StringPtr,_std::_Identity<kj::StringPtr>,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>
  local_e8;
  Reader local_b8;
  Reader local_88;
  StructBuilder local_58;
  
  local_f8.capTable = orphanage.capTable;
  local_f8.arena = orphanage.arena;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e8._M_impl.super__Rb_tree_header._M_header;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
  _::OrphanGetImpl<capnp::compiler::ParsedFile,_(capnp::Kind)3>::applyReader
            (&local_b8,&(this->content).builder);
  ParsedFile::Reader::getRoot(&local_88,&local_b8);
  decl._reader.capTable = local_88._reader.capTable;
  decl._reader.segment = local_88._reader.segment;
  decl._reader.data = local_88._reader.data;
  decl._reader.pointers = local_88._reader.pointers;
  decl._reader.dataSize = local_88._reader.dataSize;
  decl._reader.pointerCount = local_88._reader.pointerCount;
  decl._reader._38_2_ = local_88._reader._38_2_;
  decl._reader.nestingLimit = local_88._reader.nestingLimit;
  decl._reader._44_4_ = local_88._reader._44_4_;
  findImports(decl,(set<kj::StringPtr,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_> *)
                   &local_e8);
  Orphanage::
  newOrphan<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,(capnp::Kind)3>>
            (__return_storage_ptr__,&local_f8,
             (uint)local_e8._M_impl.super__Rb_tree_header._M_node_count);
  _::
  OrphanGetImpl<capnp::List<capnp::schema::CodeGeneratorRequest::RequestedFile::Import,_(capnp::Kind)3>,_(capnp::Kind)6>
  ::apply((Builder *)&local_b8,&__return_storage_ptr__->builder);
  index = 0;
  p_Var2 = local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
  while( true ) {
    if ((_Rb_tree_header *)p_Var2 == &local_e8._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<kj::StringPtr,_kj::StringPtr,_std::_Identity<kj::StringPtr>,_std::less<kj::StringPtr>,_std::allocator<kj::StringPtr>_>
      ::~_Rb_tree(&local_e8);
      return __return_storage_ptr__;
    }
    value = *(ArrayPtr<const_char> *)(p_Var2 + 1);
    importPath = *(ArrayPtr<const_char> *)(p_Var2 + 1);
    _::ListBuilder::getStructElement(&local_58,(ListBuilder *)&local_b8,index);
    MVar1 = importRelative(this,(StringPtr)importPath);
    if (MVar1.ptr == (CompiledModule *)0x0) break;
    *(uint64_t *)local_58.data = ((MVar1.ptr)->rootNode).id;
    capnp::schema::CodeGeneratorRequest::RequestedFile::Import::Builder::setName
              ((Builder *)&local_58,(Reader)value);
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
    index = index + 1;
  }
  kj::_::Debug::Fault::Fault
            (&local_100,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/compiler.c++"
             ,0x468,FAILED,"importRelative(name) != nullptr","");
  kj::_::Debug::Fault::fatal(&local_100);
}

Assistant:

Orphan<List<schema::CodeGeneratorRequest::RequestedFile::Import>>
    Compiler::CompiledModule::getFileImportTable(Orphanage orphanage) {
  // Build a table of imports for CodeGeneratorRequest.RequestedFile.imports. Note that we only
  // care about type imports, not constant value imports, since constant values (including default
  // values) are already embedded in full in the schema. In other words, we only need the imports
  // that would need to be #included in the generated code.

  std::set<kj::StringPtr> importNames;
  findImports(content.getReader().getRoot(), importNames);

  auto result = orphanage.newOrphan<List<schema::CodeGeneratorRequest::RequestedFile::Import>>(
      importNames.size());
  auto builder = result.get();

  uint i = 0;
  for (auto name: importNames) {
    // We presumably ran this import before, so it shouldn't throw now.
    auto entry = builder[i++];
    entry.setId(KJ_ASSERT_NONNULL(importRelative(name)).rootNode.getId());
    entry.setName(name);
  }

  return result;
}